

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O3

int CfdDecodeBase58(void *handle,char *base58,bool use_checksum,char **output)

{
  char *pcVar1;
  CfdException *pCVar2;
  ByteData data;
  allocator local_69;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  ByteData local_48;
  
  cfd::Initialize();
  if ((base58 != (char *)0x0) && (*base58 != '\0')) {
    if (output != (char **)0x0) {
      if (use_checksum) {
        std::__cxx11::string::string((string *)local_68,base58,&local_69);
        cfd::core::CryptoUtil::DecodeBase58Check(&local_48,(string *)local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._0_8_ != &local_58) {
          operator_delete((void *)local_68._0_8_,local_58._M_allocated_capacity + 1);
        }
        cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_68,&local_48);
        pcVar1 = cfd::capi::CreateString((string *)local_68);
      }
      else {
        std::__cxx11::string::string((string *)local_68,base58,&local_69);
        cfd::core::CryptoUtil::DecodeBase58(&local_48,(string *)local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._0_8_ != &local_58) {
          operator_delete((void *)local_68._0_8_,local_58._M_allocated_capacity + 1);
        }
        cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_68,&local_48);
        pcVar1 = cfd::capi::CreateString((string *)local_68);
      }
      *output = pcVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._0_8_ != &local_58) {
        operator_delete((void *)local_68._0_8_,local_58._M_allocated_capacity + 1);
      }
      if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return 0;
    }
    local_68._0_8_ = "cfdcapi_common.cpp";
    local_68._8_4_ = 0x3ac;
    local_58._M_allocated_capacity = 0x61d5f6;
    cfd::core::logger::log<>((CfdSourceLocation *)local_68,kCfdLogLevelWarning,"output is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_68._0_8_ = &local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"Failed to parameter. output is null.","");
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_68);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_68._0_8_ = "cfdcapi_common.cpp";
  local_68._8_4_ = 0x3a6;
  local_58._M_allocated_capacity = 0x61d5f6;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_68,kCfdLogLevelWarning,"base58 is null or empty.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  local_68._0_8_ = &local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"Failed to parameter. base58 is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_68);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdDecodeBase58(
    void* handle, const char* base58, bool use_checksum, char** output) {
  try {
    cfd::Initialize();
    if (cfd::capi::IsEmptyString(base58)) {
      warn(CFD_LOG_SOURCE, "base58 is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. base58 is null or empty.");
    }
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    if (use_checksum) {
      auto data =
          cfd::core::CryptoUtil::DecodeBase58Check(std::string(base58));
      *output = cfd::capi::CreateString(data.GetHex());
    } else {
      auto data = cfd::core::CryptoUtil::DecodeBase58(std::string(base58));
      *output = cfd::capi::CreateString(data.GetHex());
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return cfd::capi::SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    cfd::capi::SetLastFatalError(handle, std_except.what());
  } catch (...) {
    cfd::capi::SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}